

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::date_time::date_time(date_time *this,date_time *other)

{
  abstract_calendar *paVar1;
  hold_ptr<booster::locale::abstract_calendar> *in_RSI;
  abstract_calendar *in_RDI;
  abstract_calendar *this_00;
  
  this_00 = in_RDI;
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)in_RDI);
  paVar1 = hold_ptr<booster::locale::abstract_calendar>::operator->(in_RSI);
  (**paVar1->_vptr_abstract_calendar)();
  hold_ptr<booster::locale::abstract_calendar>::reset
            ((hold_ptr<booster::locale::abstract_calendar> *)this_00,in_RDI);
  return;
}

Assistant:

date_time::date_time(date_time const &other)
{
    impl_.reset(other.impl_->clone());
}